

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O1

void bloaty::macho::ParseSegment<segment_command,section>(LoadCommand cmd,RangeSink *sink)

{
  char *__string;
  int iVar1;
  char *pcVar2;
  string_view name;
  string_view name_00;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  string_view name_01;
  string_view name_02;
  string label;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  if (cmd.command_data._M_len < 0x38) {
LAB_00197faf:
    Throw("Premature EOF reading Mach-O data.",0x36);
  }
  uVar3 = cmd.command_data._M_len - 0x38;
  __string = cmd.command_data._M_str + 8;
  sVar4 = strnlen(__string,0x10);
  iVar1 = *(int *)(cmd.command_data._M_str + 0x28);
  if (sink->data_source_ == kSections) {
    pcVar2 = cmd.command_data._M_str + 0x38;
    for (iVar8 = *(int *)(cmd.command_data._M_str + 0x30); iVar8 != 0; iVar8 = iVar8 + -1) {
      if (uVar3 < 0x44) goto LAB_00197faf;
      uVar5 = (ulong)*(uint *)(pcVar2 + 0x24);
      if (((byte)pcVar2[0x38] < 0x13) && ((0x41002U >> ((byte)pcVar2[0x38] & 0x1f) & 1) != 0)) {
        uVar5 = 0;
      }
      uVar3 = uVar3 - 0x44;
      local_40 = strnlen(pcVar2,0x10);
      local_50 = sVar4;
      local_48 = __string;
      local_38 = pcVar2;
      absl::strings_internal::
      JoinAlgorithm<std::basic_string_view<char,std::char_traits<char>>const*,void>
                (&label,(strings_internal *)&local_50,&stack0xffffffffffffffd0,1,",");
      if (iVar1 == 0) {
        uVar6 = (ulong)*(uint *)(pcVar2 + 0x28);
        if (cmd.file_data._M_len < uVar6 + uVar5) goto LAB_00197fc0;
        if (cmd.file_data._M_len < uVar6) goto LAB_00197f72;
        pcVar7 = cmd.file_data._M_str + uVar6;
        pcVar9 = (sink->file_->data_)._M_str;
        if ((pcVar9 <= pcVar7) && (pcVar7 < pcVar9 + (sink->file_->data_)._M_len)) {
          if (cmd.file_data._M_len - uVar6 < uVar5) {
            uVar5 = cmd.file_data._M_len - uVar6;
          }
          name_02._M_str = label._M_dataplus._M_p;
          name_02._M_len = label._M_string_length;
          RangeSink::AddFileRange(sink,"macho_section",name_02,(long)pcVar7 - (long)pcVar9,uVar5);
        }
      }
      else {
        uVar6 = (ulong)*(uint *)(pcVar2 + 0x28);
        if (cmd.file_data._M_len < uVar6 + uVar5) {
LAB_00197fc0:
          Throw("region out-of-bounds",0x5d);
        }
        if (cmd.file_data._M_len < uVar6) {
LAB_00197f72:
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar6,cmd.file_data._M_len);
        }
        if (cmd.file_data._M_len - uVar6 < uVar5) {
          uVar5 = cmd.file_data._M_len - uVar6;
        }
        name_01._M_str = label._M_dataplus._M_p;
        name_01._M_len = label._M_string_length;
        RangeSink::AddRange(sink,"macho_section",name_01,(ulong)*(uint *)(pcVar2 + 0x20),
                            (ulong)*(uint *)(pcVar2 + 0x24),
                            (uint64_t)
                            (cmd.file_data._M_str + (uVar6 - (long)(sink->file_->data_)._M_str)),
                            uVar5);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)label._M_dataplus._M_p != &label.field_2) {
        operator_delete(label._M_dataplus._M_p,label.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = pcVar2 + 0x44;
    }
  }
  else {
    if (sink->data_source_ != kSegments) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/macho.cc"
                    ,0x11f,
                    "void bloaty::macho::ParseSegment(LoadCommand, RangeSink *) [Segment = segment_command, Section = section]"
                   );
    }
    if (iVar1 == 0) {
      uVar5 = (ulong)*(uint *)(cmd.command_data._M_str + 0x20);
      uVar3 = (ulong)*(uint *)(cmd.command_data._M_str + 0x24);
      if (cmd.file_data._M_len < uVar3 + uVar5) {
LAB_00198017:
        Throw("region out-of-bounds",0x5d);
      }
      if (cmd.file_data._M_len < uVar5) {
LAB_00198039:
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar5);
      }
      pcVar9 = cmd.file_data._M_str + uVar5;
      pcVar2 = (sink->file_->data_)._M_str;
      if ((pcVar2 <= pcVar9) && (pcVar9 < pcVar2 + (sink->file_->data_)._M_len)) {
        if (cmd.file_data._M_len - uVar5 < uVar3) {
          uVar3 = cmd.file_data._M_len - uVar5;
        }
        name_00._M_str = __string;
        name_00._M_len = sVar4;
        RangeSink::AddFileRange(sink,"macho_segment",name_00,(long)pcVar9 - (long)pcVar2,uVar3);
        return;
      }
    }
    else {
      uVar5 = (ulong)*(uint *)(cmd.command_data._M_str + 0x20);
      uVar3 = (ulong)*(uint *)(cmd.command_data._M_str + 0x24);
      if (cmd.file_data._M_len < uVar3 + uVar5) goto LAB_00198017;
      if (cmd.file_data._M_len < uVar5) goto LAB_00198039;
      if (cmd.file_data._M_len - uVar5 < uVar3) {
        uVar3 = cmd.file_data._M_len - uVar5;
      }
      name._M_str = __string;
      name._M_len = sVar4;
      RangeSink::AddRange(sink,"macho_segment",name,(ulong)*(uint *)(cmd.command_data._M_str + 0x18)
                          ,(ulong)*(uint *)(cmd.command_data._M_str + 0x1c),
                          (uint64_t)
                          (cmd.file_data._M_str + (uVar5 - (long)(sink->file_->data_)._M_str)),uVar3
                         );
    }
  }
  return;
}

Assistant:

const T* GetStructPointerAndAdvance(string_view* data) {
  const T* ret = GetStructPointer<T>(*data);
  *data = data->substr(sizeof(T));
  return ret;
}